

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_compress.c
# Opt level: O2

wchar_t archive_compressor_compress_close(archive_write_filter *f)

{
  void *__ptr;
  void *pvVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  int iVar4;
  
  __ptr = f->data;
  wVar2 = output_code(f,*(wchar_t *)((long)__ptr + 0x65164));
  if (wVar2 == L'\0') {
    pvVar1 = f->data;
    iVar4 = *(int *)((long)pvVar1 + 0x6516c) % 8;
    if (iVar4 != 0) {
      *(uint *)((long)pvVar1 + 0x18) = iVar4 + 7U >> 3;
      wVar2 = output_byte(f,*(uchar *)((long)pvVar1 + 0x65170));
      if (wVar2 != L'\0') goto LAB_0013a462;
    }
    wVar2 = __archive_write_filter
                      (f->next_filter,*(void **)((long)__ptr + 0x65178),
                       *(size_t *)((long)__ptr + 0x65188));
  }
LAB_0013a462:
  wVar3 = __archive_write_close_filter(f->next_filter);
  if (wVar2 < wVar3) {
    wVar3 = wVar2;
  }
  free(*(void **)((long)__ptr + 0x65178));
  free(__ptr);
  return wVar3;
}

Assistant:

static int
archive_compressor_compress_close(struct archive_write_filter *f)
{
	struct private_data *state = (struct private_data *)f->data;
	int ret, ret2;

	ret = output_code(f, state->cur_code);
	if (ret != ARCHIVE_OK)
		goto cleanup;
	ret = output_flush(f);
	if (ret != ARCHIVE_OK)
		goto cleanup;

	/* Write the last block */
	ret = __archive_write_filter(f->next_filter,
	    state->compressed, state->compressed_offset);
cleanup:
	ret2 = __archive_write_close_filter(f->next_filter);
	if (ret > ret2)
		ret = ret2;
	free(state->compressed);
	free(state);
	return (ret);
}